

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall
kratos::AssignStmt::AssignStmt
          (AssignStmt *this,shared_ptr<kratos::Var> *left,shared_ptr<kratos::Var> *right,
          AssignmentType type)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  Var *pVVar4;
  _func_int **value;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint *puVar5;
  undefined1 auVar6 [8];
  element_type *peVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint32_t uVar11;
  ConstantLegal CVar12;
  UserException *pUVar13;
  StmtException *this_01;
  VarException *pVVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  initializer_list<kratos::IRNode_*> __l_02;
  element_type *local_e8;
  element_type *local_e0;
  _func_int **local_d8;
  element_type *peStack_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8 [4];
  _Alloc_hider local_98;
  element_type *right_ptr;
  undefined1 auStack_78 [8];
  shared_ptr<kratos::Const> const_;
  allocator_type local_31;
  
  (this->super_Stmt).super_enable_shared_from_this<kratos::Stmt>._M_weak_this.
  super___weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Stmt).super_enable_shared_from_this<kratos::Stmt>._M_weak_this.
  super___weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Stmt).super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_Stmt).super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_Stmt).super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_Stmt).super_IRNode.comment._M_dataplus._M_p =
       (pointer)&(this->super_Stmt).super_IRNode.comment.field_2;
  (this->super_Stmt).super_IRNode.comment._M_string_length = 0;
  (this->super_Stmt).super_IRNode.comment.field_2._M_local_buf[0] = '\0';
  (this->super_Stmt).super_IRNode.ast_node_type_ = StmtKind;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Stmt).super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Stmt).type_ = Assign;
  (this->super_Stmt).parent_ = (IRNode *)0x0;
  (this->super_Stmt).stmt_id_ = -1;
  p_Var1 = &(this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_Stmt).scope_context_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002bd360;
  peVar2 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->left_ = peVar2;
  peVar3 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->right_ = peVar3;
  this->assign_type_ = type;
  (this->delay_).super__Optional_base<kratos::EventControl,_true,_true>._M_payload.
  super__Optional_payload_base<kratos::EventControl>.field_0x24 = 0;
  if (peVar2 == (element_type *)0x0) {
    pUVar13 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_78 = (undefined1  [8])
                 &const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_78,"left hand side is empty","");
    UserException::UserException(pUVar13,(string *)auStack_78);
    __cxa_throw(pUVar13,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (peVar3 == (element_type *)0x0) {
    pUVar13 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_78 = (undefined1  [8])
                 &const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_78,"right hand side is empty","");
    UserException::UserException(pUVar13,(string *)auStack_78);
    __cxa_throw(pUVar13,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (peVar2->is_signed_ != peVar3->is_signed_) {
    pVVar14 = (VarException *)__cxa_allocate_exception(0x10);
    (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      _vptr_IRNode[0x1f])(&local_d8);
    (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      _vptr_IRNode[0x1f])(local_b8);
    auStack_78 = (undefined1  [8])local_d8;
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_b8[0];
    format_str.size_ = 0x77dd;
    format_str.data_ = (char *)0x3d;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_78;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,
               (detail *)"left ({0})\'s sign does not match with right ({1}). {2} <- {3}",format_str
               ,args);
    local_e8 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e0 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_e8;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_78
               ,__l,&local_31);
    VarException::VarException
              (pVVar14,(string *)&stack0xffffffffffffff68,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_78
              );
    __cxa_throw(pVVar14,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar9 = (*(peVar2->super_IRNode)._vptr_IRNode[7])();
  iVar10 = (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             super_IRNode)._vptr_IRNode[7])();
  if (iVar9 != iVar10) {
    pVVar4 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (pVVar4->type_ == ConstValue) {
      Var::as<kratos::Const>((Var *)auStack_78);
      value = (((element_type *)((long)auStack_78 + 0x270))->super_IRNode)._vptr_IRNode;
      uVar11 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 super_IRNode)._vptr_IRNode[7])();
      CVar12 = Const::is_legal((int64_t)value,uVar11,
                               ((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->is_signed_);
      auVar6 = auStack_78;
      if (CVar12 != Legal) {
        if (const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        goto LAB_001bf9d6;
      }
      uVar11 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 super_IRNode)._vptr_IRNode[7])();
      Const::set_width((Const *)auVar6,uVar11);
    }
    else {
      bVar8 = IterVar::has_iter_var(pVVar4);
      if (!bVar8) goto LAB_001bf9d6;
      pVVar4 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar11 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 super_IRNode)._vptr_IRNode[7])();
      bVar8 = IterVar::safe_to_resize
                        (pVVar4,uVar11,
                         ((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         )->is_signed_);
      if (!bVar8) goto LAB_001bf9d6;
      local_98._M_p =
           (pointer)(right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar11 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 super_IRNode)._vptr_IRNode[7])();
      IterVar::fix_width((Var **)&stack0xffffffffffffff68,uVar11);
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_78,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(local_98._M_p + 0x68));
      peVar7 = const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      auVar6 = auStack_78;
      auStack_78 = (undefined1  [8])0x0;
      const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      this_00 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                _M_pi;
      (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)auVar6;
      (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    if (const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    iVar9 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    iVar10 = (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_IRNode)._vptr_IRNode[7])();
    if (iVar9 != iVar10) {
LAB_001bf9d6:
      pVVar14 = (VarException *)__cxa_allocate_exception(0x10);
      (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode)
        ._vptr_IRNode[0x1f])(&local_d8);
      (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode
        )._vptr_IRNode[0x1f])(local_b8);
      (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode)
        ._vptr_IRNode[7])();
      (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode
        )._vptr_IRNode[7])();
      auStack_78 = (undefined1  [8])local_d8;
      const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
      const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_b8[0];
      format_str_01.size_ = 0x22dd;
      format_str_01.data_ = (char *)0x3e;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_78;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)&stack0xffffffffffffff68,
                 (detail *)"left ({0})\'s width does not match with right ({1}). {2} <- {3}",
                 format_str_01,args_01);
      local_e8 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_e0 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&local_e8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_78,__l_01,&local_31);
      VarException::VarException
                (pVVar14,(string *)&stack0xffffffffffffff68,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 auStack_78);
      __cxa_throw(pVVar14,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
    this->right_ = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  peVar2 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  puVar5 = (peVar2->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((*puVar5 < 2) &&
      ((ulong)((long)(peVar2->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) < 5)) &&
     (peVar2->explicit_array_ == false)) {
    peVar3 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    puVar5 = (peVar3->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (((*puVar5 < 2) &&
        ((ulong)((long)(peVar3->size_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar5) < 5)) &&
       (peVar3->explicit_array_ != true)) {
      return;
    }
  }
  iVar9 = (*(peVar2->super_IRNode)._vptr_IRNode[0x18])();
  iVar10 = (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             super_IRNode)._vptr_IRNode[0x18])();
  if ((char)iVar9 == (char)iVar10) {
    return;
  }
  iVar9 = (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0x18])();
  this_01 = (StmtException *)__cxa_allocate_exception(0x10);
  if ((char)iVar9 == '\0') {
    (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      _vptr_IRNode[0x1f])(&local_d8);
    (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      _vptr_IRNode[0x1f])(local_b8);
    auStack_78 = (undefined1  [8])local_d8;
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
    const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_b8[0];
    format_str_02.size_ = 0xdd;
    format_str_02.data_ = (char *)0x32;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_78;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)&stack0xffffffffffffff68,
               (detail *)"right ({1}) is packed array but left ({0}) is not.",format_str_02,args_02)
    ;
    local_e8 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e0 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l_02._M_len = 2;
    __l_02._M_array = (iterator)&local_e8;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78,__l_02,
               (allocator_type *)&local_31);
    StmtException::StmtException
              (this_01,(string *)&stack0xffffffffffffff68,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78);
    __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  (*(((left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
    _vptr_IRNode[0x1f])(&local_d8);
  (*(((right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
    _vptr_IRNode[0x1f])(local_b8);
  auStack_78 = (undefined1  [8])local_d8;
  const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_d0;
  const_.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_b8[0];
  format_str_00.size_ = 0xdd;
  format_str_00.data_ = (char *)0x32;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)auStack_78;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&stack0xffffffffffffff68,
             (detail *)"left ({0}) is packed array but right ({1}) is not.",format_str_00,args_00);
  local_e8 = (left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e0 = (right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_e8;
  std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
            ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78,__l_00,
             (allocator_type *)&local_31);
  StmtException::StmtException
            (this_01,(string *)&stack0xffffffffffffff68,
             (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_78);
  __cxa_throw(this_01,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

AssignStmt::AssignStmt(const std::shared_ptr<Var> &left, std::shared_ptr<Var> right,
                       AssignmentType type)
    : Stmt(StatementType ::Assign), left_(left.get()), right_(right.get()), assign_type_(type) {
    if (left == nullptr) throw UserException("left hand side is empty");
    if (right == nullptr) throw UserException("right hand side is empty");
    // check for sign
    if (left->is_signed() != right->is_signed()) {
        throw VarException(
            ::format("left ({0})'s sign does not match with right ({1}). {2} <- {3}",
                     left->to_string(), right->to_string(), left->is_signed(), right->is_signed()),
            {left.get(), right.get()});
    }
    // check for width
    if (left->width() != right->width()) {
        // up scale or down scale if the right hand side is a const, and it is allowed
        bool has_error = true;
        if (right->type() == VarType::ConstValue) {
            auto const_ = right->as<Const>();
            if (Const::is_legal(const_->value(), left->width(), left->is_signed()) ==
                Const::ConstantLegal::Legal) {
                has_error = false;
                const_->set_width(left->width());
            }
        } else if (IterVar::has_iter_var(right.get())) {
            // need to resize it
            if (IterVar::safe_to_resize(right.get(), left->width(), left->is_signed())) {
                // fix the width
                auto *right_ptr = right.get();
                IterVar::fix_width(right_ptr, left->width());
                right = right_ptr->shared_from_this();
                has_error = false;
            }
        }
        if (has_error || left->width() != right->width()) {
            throw VarException(
                ::format("left ({0})'s width does not match with right ({1}). {2} <- {3}",
                         left->to_string(), right->to_string(), left->width(), right->width()),
                {left.get(), right.get()});
        } else {
            // reassign
            right_ = right.get();
        }
    }
    if (((left->size().front() > 1 || left->size().size() > 1 || left->explicit_array()) ||
         (right->size().front() > 1 || right->size().size() > 1 || right->explicit_array())) &&
        left->is_packed() != right->is_packed()) {
        if (left->is_packed())
            throw StmtException(::format("left ({0}) is packed array but right ({1}) is not.",
                                         left->to_string(), right->to_string()),
                                {left.get(), right.get()});
        else
            throw StmtException(::format("right ({1}) is packed array but left ({0}) is not.",
                                         left->to_string(), right->to_string()),
                                {left.get(), right.get()});
    }
}